

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::destroy
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this)

{
  SignalPromiseAdapter *pSVar1;
  SignalPromiseAdapter **ppSVar2;
  
  ppSVar2 = (this->adapter).prev;
  if (ppSVar2 != (SignalPromiseAdapter **)0x0) {
    pSVar1 = (this->adapter).next;
    if (pSVar1 == (SignalPromiseAdapter *)0x0) {
      ((this->adapter).loop)->signalTail = ppSVar2;
    }
    else {
      pSVar1->prev = ppSVar2;
      ppSVar2 = (this->adapter).prev;
    }
    *ppSVar2 = pSVar1;
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<siginfo_t>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }